

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_scalingFactorWithTwoEmptyUnits_Test::TestBody(Units_scalingFactorWithTwoEmptyUnits_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  double local_b0;
  double local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Units_scalingFactorWithTwoEmptyUnits_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"u1",&local_41);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"u2",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_a8 = 0.0;
  local_b0 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)local_68,(shared_ptr *)local_20,true);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_a0,"0.0","libcellml::Units::scalingFactor(u2, u1)",&local_a8,
             &local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x47c,pcVar3);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Units, scalingFactorWithTwoEmptyUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}